

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logreplay.c
# Opt level: O1

int replay_display_objects(nh_objitem *items,int icount,char *title,int how,nh_objresult *pick_list)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  long lVar4;
  int *piVar5;
  long lVar6;
  long lVar7;
  int id;
  int local_38;
  int local_34;
  
  lVar6 = 0;
  if (1 < how + 1U) {
    local_34 = icount;
    pcVar3 = next_log_token();
    if ((pcVar3 == (char *)0x0) || (*pcVar3 != 'o')) {
      parse_error("Bad object menu data");
    }
    lVar6 = 0xffffffff;
    if (pcVar3[2] != 'x') {
      pcVar3 = pcVar3 + 3;
      lVar6 = 0;
      iVar2 = __isoc99_sscanf(pcVar3,"%x,%x:",&local_38);
      if (iVar2 != 0) {
        lVar7 = (long)local_34;
        lVar6 = 0;
        do {
          if (local_34 < 1) {
LAB_001b8de0:
            parse_error("Invalid menu id in object menu data");
          }
          lVar4 = 1;
          bVar1 = false;
          piVar5 = &items->id;
          do {
            if (*piVar5 == local_38) {
              bVar1 = true;
            }
            if (lVar7 <= lVar4) break;
            piVar5 = piVar5 + 0x49;
            lVar4 = lVar4 + 1;
          } while (!bVar1);
          if (!bVar1) goto LAB_001b8de0;
          pick_list[lVar6].id = local_38;
          pick_list[lVar6].count = -1;
          lVar6 = lVar6 + 1;
          pcVar3 = strchr(pcVar3,0x3a);
          pcVar3 = pcVar3 + 1;
          iVar2 = __isoc99_sscanf(pcVar3,"%x,%x:",&local_38);
        } while (iVar2 != 0);
      }
    }
  }
  return (int)lVar6;
}

Assistant:

static int replay_display_objects(struct nh_objitem *items, int icount, const char *title,
			int how, struct nh_objresult *pick_list)
{
    int i, j, id, count;
    char *token;
    char *resultbuf;
    boolean id_ok;
    
    if (how == PICK_NONE || how == PICK_INVACTION)
	return 0;
    
    token = next_log_token();
    if (!token || token[0] != 'o')
	parse_error("Bad object menu data");
    resultbuf = token + 2;
    
    if (*resultbuf++ == 'x')
	return -1;
    
    i = 0;
    count = -1;
    while (sscanf(resultbuf, "%x,%x:", &id, &count)) {
	/* make sure all ids are valid - program changes could have broken the save */
	id_ok  = FALSE;
	for (j = 0; j < icount && !id_ok; j++)
	    if (items[j].id == id)
		id_ok = TRUE;
	if (!id_ok)
	    parse_error("Invalid menu id in object menu data");
	
	pick_list[i].id = id;
	pick_list[i].count = count;
	i++;
	resultbuf = strchr(resultbuf, ':') + 1;
	count = -1;
    }

    return i;
}